

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_mdef_gen.c
# Opt level: O3

int32 make_ci_list_frm_mdef(char *mdeffile,char ***CIlist,int32 *cilistsize)

{
  acmod_id_t aVar1;
  int iVar2;
  int32 iVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  char **ppcVar7;
  char *__src;
  size_t sVar8;
  acmod_id_t id;
  size_t d1;
  model_def_t *mdef;
  model_def_t *local_30;
  
  iVar3 = model_def_read(&local_30,mdeffile);
  if (iVar3 != 0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x50,"Unable to read mdef file %s\n",mdeffile);
  }
  aVar1 = local_30->acmod_set->n_ci;
  d1 = (size_t)(int)aVar1;
  *cilistsize = aVar1;
  if ((long)d1 < 1) {
    ppcVar7 = (char **)__ckd_calloc_2d__(d1,1,1,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                         ,0x59);
    *CIlist = ppcVar7;
  }
  else {
    id = 0;
    iVar4 = 0;
    do {
      pcVar5 = acmod_set_id2name(local_30->acmod_set,id);
      sVar6 = strlen(pcVar5);
      iVar2 = (int)sVar6;
      if ((int)sVar6 < iVar4) {
        iVar2 = iVar4;
      }
      iVar4 = iVar2;
      id = id + 1;
    } while (aVar1 != id);
    ppcVar7 = (char **)__ckd_calloc_2d__(d1,(ulong)(iVar4 + 1),1,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                         ,0x59);
    *CIlist = ppcVar7;
    if (0 < (int)aVar1) {
      sVar8 = 0;
      do {
        pcVar5 = ppcVar7[sVar8];
        __src = acmod_set_id2name(local_30->acmod_set,(acmod_id_t)sVar8);
        strcpy(pcVar5,__src);
        sVar8 = sVar8 + 1;
      } while (d1 != sVar8);
    }
  }
  return 0;
}

Assistant:

int32 make_ci_list_frm_mdef(const char  *mdeffile,
		            char  ***CIlist, 
                            int32 *cilistsize)
{
    char  **cilist;

    int32 nciphns, id, maxphnsize, phnsize;
    model_def_t *mdef;

    if (model_def_read(&mdef, mdeffile) != S3_SUCCESS) 
	E_ERROR("Unable to read mdef file %s\n",mdeffile);
    *cilistsize = nciphns = mdef->acmod_set->n_ci;

   /* Find phone length */
    maxphnsize = 0;
    for (id = 0; id < nciphns; id++){
	phnsize = strlen(acmod_set_id2name(mdef->acmod_set,id));
 	if (phnsize > maxphnsize) maxphnsize = phnsize;
    }
    *CIlist = cilist = (char**)ckd_calloc_2d(nciphns,maxphnsize+1,sizeof(char));
    for (id = 0; id < nciphns; id++){
        strcpy(cilist[id],acmod_set_id2name(mdef->acmod_set,id));
    }

    return S3_SUCCESS;
}